

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TrackBuilder.cpp
# Opt level: O0

void __thiscall
TrackBuilder::addAmigaSector(TrackBuilder *this,CylHead *cylhead,int sector,void *buf)

{
  int iVar1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_88;
  undefined1 local_60 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> bits;
  uint32_t sector_label [4];
  uint32_t info;
  uint32_t checksum;
  int remain;
  int sectors;
  void *buf_local;
  int sector_local;
  CylHead *cylhead_local;
  TrackBuilder *this_local;
  
  addByte(this,0);
  addByteWithClock(this,0xa1,10);
  addByteWithClock(this,0xa1,10);
  iVar1 = 0xb;
  if (this->m_datarate == _500K) {
    iVar1 = 0x16;
  }
  sector_label[3] = 0;
  sector_label[2] =
       cylhead->cyl << 0x11 | cylhead->head << 0x10 | sector << 8 | iVar1 - sector | 0xff000000;
  addAmigaDword(this,sector_label[2],sector_label + 3);
  bits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  sector_label[0] = 0;
  sector_label[1] = 0;
  splitAmigaBits((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_60,this,
                 &bits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,0x10,sector_label + 3);
  addAmigaBits(this,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_60);
  addAmigaDword(this,sector_label[3],sector_label + 3);
  sector_label[3] = 0;
  splitAmigaBits(&local_88,this,buf,0x200,sector_label + 3);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_60,&local_88);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_88);
  addAmigaDword(this,sector_label[3],sector_label + 3);
  addAmigaBits(this,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_60);
  addByte(this,0);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_60);
  return;
}

Assistant:

void TrackBuilder::addAmigaSector(const CylHead& cylhead, int sector, const void* buf)
{
    addByte(0x00);
    addByteWithClock(0xa1, 0x0a);   // A1 with missing clock bit
    addByteWithClock(0xa1, 0x0a);

    auto sectors = (m_datarate == DataRate::_500K) ? 22 : 11;
    auto remain = sectors - sector;

    uint32_t checksum = 0;
    uint32_t info = (0xff << 24) | (((cylhead.cyl << 1) | cylhead.head) << 16) |
        (sector << 8) | remain;
    addAmigaDword(info, checksum);

    uint32_t sector_label[4] = {};
    auto bits = splitAmigaBits(sector_label, sizeof(sector_label), checksum);
    addAmigaBits(bits);
    addAmigaDword(checksum, checksum);

    checksum = 0;
    bits = splitAmigaBits(buf, 512, checksum);
    addAmigaDword(checksum, checksum);
    addAmigaBits(bits);

    addByte(0x00);
}